

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQFunctionScopeForStage.cpp
# Opt level: O1

void __thiscall
FactoredQFunctionScopeForStage::RemoveLocalQ(FactoredQFunctionScopeForStage *this,Index j)

{
  pointer pSVar1;
  ulong uVar2;
  E *this_00;
  ulong uVar3;
  
  uVar2 = (ulong)j;
  pSVar1 = (this->_m_sfacScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_m_sfacScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
  if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
    std::vector<Scope,_std::allocator<Scope>_>::_M_erase(&this->_m_sfacScopes,pSVar1 + uVar2);
    std::vector<Scope,_std::allocator<Scope>_>::_M_erase
              (&this->_m_agentScopes,
               (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start + uVar2);
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"FactoredQFunctionScopeForStage::RemoveLocalQ( Index j), index j out of bounds");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void 
FactoredQFunctionScopeForStage::RemoveLocalQ( Index j)
{
    if(j >= _m_sfacScopes.size())
        throw E("FactoredQFunctionScopeForStage::RemoveLocalQ( Index j), index j out of bounds");

    _m_sfacScopes.erase(_m_sfacScopes.begin() + j );
    _m_agentScopes.erase(_m_agentScopes.begin() + j );
}